

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

Mat6x6d * __thiscall OpenMD::HydroProp::getS(HydroProp *this)

{
  long in_RSI;
  HydroProp *in_RDI;
  HydroProp *this_00;
  
  this_00 = in_RDI;
  if ((*(byte *)(in_RSI + 0x27a) & 1) == 0) {
    complete(in_RDI);
  }
  SquareMatrix<double,_6>::SquareMatrix
            ((SquareMatrix<double,_6> *)this_00,(SquareMatrix<double,_6> *)in_RDI);
  return (Mat6x6d *)this_00;
}

Assistant:

Mat6x6d HydroProp::getS() {
    if (!hasS_) { complete(); }
    return S_;
  }